

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QSslError,QSslError>
                    (QList<QSslError> *vector,QSslError *u,qsizetype from)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  QSslError *this;
  qsizetype qVar5;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar1 = (vector->d).size;
  if ((ulong)from < uVar1) {
    this = (vector->d).ptr + from * 8;
    qVar5 = 8 - (long)this;
    lVar2 = uVar1 * 8 + from * -8;
    do {
      lVar4 = lVar2;
      if (lVar4 == 0) goto LAB_0013b36c;
      cVar3 = QSslError::operator==(this,u);
      qVar5 = qVar5 + -8;
      this = this + 8;
      lVar2 = lVar4 + -8;
    } while (cVar3 == '\0');
    qVar5 = -(long)((vector->d).ptr + qVar5) >> 3;
LAB_0013b36c:
    if (lVar4 != 0) {
      return qVar5;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}